

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::anon_unknown_0::SanitizeNameForObjC
                   (string *__return_storage_ptr__,string *input,string *extension,
                   string *out_suffix_added)

{
  size_type sVar1;
  
  sVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)(anonymous_namespace)::kReservedWords_abi_cxx11_,input);
  if (sVar1 == 0) {
    if (out_suffix_added != (string *)0x0) {
      out_suffix_added->_M_string_length = 0;
      *(out_suffix_added->_M_dataplus)._M_p = '\0';
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  else {
    if (out_suffix_added != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)out_suffix_added);
    }
    std::operator+(__return_storage_ptr__,input,extension);
  }
  return __return_storage_ptr__;
}

Assistant:

string SanitizeNameForObjC(const string& input,
                           const string& extension,
                           string* out_suffix_added) {
  if (kReservedWords.count(input) > 0) {
    if (out_suffix_added) *out_suffix_added = extension;
    return input + extension;
  }
  if (out_suffix_added) out_suffix_added->clear();
  return input;
}